

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBoneSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CBoneSceneNode::helper_updateAbsolutePositionOfAllChildren
          (CBoneSceneNode *this,ISceneNode *Node)

{
  _List_node_base *p_Var1;
  
  (*Node->_vptr_ISceneNode[0x20])(Node);
  for (p_Var1 = (Node->Children).
                super__List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&Node->Children; p_Var1 = p_Var1->_M_next) {
    helper_updateAbsolutePositionOfAllChildren(this,(ISceneNode *)p_Var1[1]._M_next);
  }
  return;
}

Assistant:

void CBoneSceneNode::helper_updateAbsolutePositionOfAllChildren(ISceneNode *Node)
{
	Node->updateAbsolutePosition();

	ISceneNodeList::const_iterator it = Node->getChildren().begin();
	for (; it != Node->getChildren().end(); ++it) {
		helper_updateAbsolutePositionOfAllChildren((*it));
	}
}